

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O2

void cshutdn_perform(cshutdn *cshutdn,Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  Curl_llist_node *n;
  size_t sVar2;
  Curl_llist_node *pCVar3;
  connectdata *conn;
  timediff_t tVar4;
  long lVar5;
  long milli;
  curltime cVar6;
  _Bool done;
  curltime *local_48;
  curltime local_40;
  
  n = Curl_llist_head(&cshutdn->list);
  if (n != (Curl_llist_node *)0x0) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_multi.log_level)) {
      sVar2 = Curl_llist_count(&cshutdn->list);
      Curl_trc_multi(data,"[SHUTDOWN] perform on %zu connections",sVar2);
    }
    local_48 = (curltime *)0x0;
    milli = 0;
    while (n != (Curl_llist_node *)0x0) {
      pCVar3 = Curl_node_next(n);
      conn = (connectdata *)Curl_node_elem(n);
      Curl_cshutdn_run_once(data,conn,&done);
      if (done == true) {
        Curl_node_remove(n);
        Curl_cshutdn_terminate(data,conn,false);
        n = pCVar3;
      }
      else {
        if (local_48 == (curltime *)0x0) {
          cVar6 = Curl_now();
          local_40.tv_sec = cVar6.tv_sec;
          local_40.tv_usec = cVar6.tv_usec;
          local_48 = &local_40;
        }
        tVar4 = Curl_conn_shutdown_timeleft(conn,local_48);
        lVar5 = milli;
        if (tVar4 < milli) {
          lVar5 = tVar4;
        }
        n = pCVar3;
        if (tVar4 != 0) {
          milli = lVar5;
        }
      }
    }
    if (milli != 0) {
      Curl_expire_ex(data,local_48,milli,EXPIRE_SHUTDOWN);
    }
  }
  return;
}

Assistant:

static void cshutdn_perform(struct cshutdn *cshutdn,
                              struct Curl_easy *data)
{
  struct Curl_llist_node *e = Curl_llist_head(&cshutdn->list);
  struct Curl_llist_node *enext;
  struct connectdata *conn;
  struct curltime *nowp = NULL;
  struct curltime now;
  timediff_t next_expire_ms = 0, ms;
  bool done;

  if(!e)
    return;

  CURL_TRC_M(data, "[SHUTDOWN] perform on %zu connections",
             Curl_llist_count(&cshutdn->list));
  while(e) {
    enext = Curl_node_next(e);
    conn = Curl_node_elem(e);
    Curl_cshutdn_run_once(data, conn, &done);
    if(done) {
      Curl_node_remove(e);
      Curl_cshutdn_terminate(data, conn, FALSE);
    }
    else {
      /* idata has one timer list, but maybe more than one connection.
       * Set EXPIRE_SHUTDOWN to the smallest time left for all. */
      if(!nowp) {
        now = Curl_now();
        nowp = &now;
      }
      ms = Curl_conn_shutdown_timeleft(conn, nowp);
      if(ms && ms < next_expire_ms)
        next_expire_ms = ms;
    }
    e = enext;
  }

  if(next_expire_ms)
    Curl_expire_ex(data, nowp, next_expire_ms, EXPIRE_SHUTDOWN);
}